

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgdesll(fitsfile *fptr,int colnum,LONGLONG rownum,LONGLONG *length,LONGLONG *heapaddr,
            int *status)

{
  int iVar1;
  long *values;
  fitsfile *fptr_00;
  ulong *in_RCX;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  ulong *in_R8;
  int *in_R9;
  int *unaff_retaddr;
  tcolumn *colptr;
  LONGLONG descript8 [2];
  uint descript4 [2];
  LONGLONG bytepos;
  int *in_stack_000000a0;
  fitsfile *in_stack_000000a8;
  int *in_stack_ffffffffffffff98;
  ulong in_stack_ffffffffffffffa8;
  ulong in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  int local_4;
  
  memset(&stack0xffffffffffffffb8,0,8);
  memset(&stack0xffffffffffffffa8,0,0x10);
  if (*in_R9 < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_000000a8,in_stack_000000a0), 0 < iVar1)) {
        return *in_R9;
      }
    }
    else {
      ffmahd((fitsfile *)descript8[1],descript8[0]._4_4_,(int *)colptr,unaff_retaddr);
    }
    values = (long *)(*(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(in_ESI + -1) * 0xa0);
    if ((int)values[10] < 0) {
      fptr_00 = (fitsfile *)
                (*(long *)(*(long *)(in_RDI + 2) + 0x88) +
                 *(long *)(*(long *)(in_RDI + 2) + 0x3c8) * (in_RDX + -1) + values[9]);
      if ((*(char *)((long)values + 0x8c) == 'P') || (*(char *)((long)values + 0x8d) == 'P')) {
        iVar1 = ffgi4b(fptr_00,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(int *)values,
                       in_stack_ffffffffffffff98);
        if (iVar1 < 1) {
          if (in_RCX != (ulong *)0x0) {
            *in_RCX = (ulong)in_stack_ffffffffffffffb8;
          }
          if (in_R8 != (ulong *)0x0) {
            *in_R8 = (ulong)in_stack_ffffffffffffffbc;
          }
        }
      }
      else {
        iVar1 = ffgi8b(fptr_00,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,values,
                       in_stack_ffffffffffffff98);
        if (iVar1 < 1) {
          if (in_RCX != (ulong *)0x0) {
            *in_RCX = in_stack_ffffffffffffffa8;
          }
          if (in_R8 != (ulong *)0x0) {
            *in_R8 = in_stack_ffffffffffffffb0;
          }
        }
      }
      local_4 = *in_R9;
    }
    else {
      *in_R9 = 0x13d;
      local_4 = *in_R9;
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffgdesll(fitsfile *fptr,   /* I - FITS file pointer                       */
           int colnum,         /* I - column number (1 = 1st column of table) */
           LONGLONG rownum,        /* I - row number (1 = 1st row of table)       */
           LONGLONG *length,   /* O - number of elements in the row           */
           LONGLONG *heapaddr, /* O - heap pointer to the data                */
           int *status)        /* IO - error status                           */
/*
  get (read) the variable length vector descriptor from the binary table.
  This is similar to ffgdes, except it supports the full 8-byte range of the
  length and offset values in 'Q' columns, as well as 'P' columns.
*/
{
    LONGLONG bytepos;
    unsigned int descript4[2] = {0,0};
    LONGLONG descript8[2] = {0,0};
    tcolumn *colptr;

    if (*status > 0)
       return(*status);
       
    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */
    colptr += (colnum - 1);   /* offset to the correct column */

    if (colptr->tdatatype >= 0) {
        *status = NOT_VARI_LEN;
        return(*status);
    }

    bytepos = (fptr->Fptr)->datastart + 
                  ((fptr->Fptr)->rowlength * (rownum - 1)) +
                   colptr->tbcol;

    if (colptr->tform[0] == 'P' || colptr->tform[1] == 'P')
    {
        /* read 4-byte descriptor */
        if (ffgi4b(fptr, bytepos, 2, 4, (INT32BIT *) descript4, status) <= 0) 
        {
           if (length)
             *length = (LONGLONG) descript4[0];   /* 1st word is the length  */
           if (heapaddr)
             *heapaddr = (LONGLONG) descript4[1]; /* 2nd word is the address */
        }

    }
    else  /* this is for 'Q' columns */
    {
        /* read 8 byte descriptor */
        if (ffgi8b(fptr, bytepos, 2, 8, (long *) descript8, status) <= 0) 
        {
           if (length)
             *length = descript8[0];   /* 1st word is the length  */
           if (heapaddr)
             *heapaddr = descript8[1]; /* 2nd word is the address */
        }
    }     

    return(*status);
}